

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral.hpp
# Opt level: O0

int __thiscall
kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_>::closer
          (miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_> *this,UI *ui)

{
  value_type vVar1;
  value_type vVar2;
  int extraout_EAX;
  uint uVar3;
  uint uVar4;
  uint extraout_EAX_00;
  vector<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
  *transforms;
  vector<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
  *pvVar5;
  reference pvVar6;
  value_type j;
  uint i;
  undefined4 in_stack_ffffffffffffffb8;
  value_type in_stack_ffffffffffffffbc;
  value_type in_stack_ffffffffffffffc0;
  value_type in_stack_ffffffffffffffc4;
  value_type in_stack_ffffffffffffffe8;
  uint uVar7;
  
  uVar7 = 0;
  do {
    transforms = (vector<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
                  *)(ulong)uVar7;
    pvVar5 = (vector<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
              *)spectrum::size((spectrum *)0x1237b3);
    if (pvVar5 <= transforms) {
      uVar3 = transformation_costs(this,transforms);
      uVar4 = transformation_costs(this,transforms);
      if (uVar3 < uVar4) {
        update_best((miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_> *)ui,
                    (spectrum *)CONCAT44(uVar7,in_stack_ffffffffffffffe8));
        uVar3 = extraout_EAX_00;
      }
      return uVar3;
    }
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->order,(ulong)uVar7);
    in_stack_ffffffffffffffe8 = *pvVar6;
    vVar1 = spectrum::operator[]
                      ((spectrum *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    vVar2 = spectrum::operator[]
                      ((spectrum *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (vVar1 != vVar2) {
      vVar1 = spectrum::operator[]
                        ((spectrum *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      if (vVar1 < 1) {
        vVar1 = -vVar1;
      }
      vVar2 = spectrum::operator[]
                        ((spectrum *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      if (vVar2 < 1) {
        vVar2 = -vVar2;
      }
      if (vVar2 < vVar1) {
LAB_001238c7:
        update_best((miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_> *)ui,
                    (spectrum *)CONCAT44(uVar7,in_stack_ffffffffffffffe8));
        return extraout_EAX;
      }
      vVar1 = spectrum::operator[]
                        ((spectrum *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      if (vVar1 < 1) {
        vVar1 = -vVar1;
      }
      vVar2 = spectrum::operator[]
                        ((spectrum *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      if (vVar2 < 1) {
        vVar2 = -vVar2;
      }
      if (vVar1 == vVar2) {
        vVar1 = spectrum::operator[]
                          ((spectrum *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                           ,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        vVar2 = spectrum::operator[]
                          ((spectrum *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                           ,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        if (vVar2 < vVar1) goto LAB_001238c7;
      }
      in_stack_ffffffffffffffc4 =
           spectrum::operator[]
                     ((spectrum *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      if (in_stack_ffffffffffffffc4 < 1) {
        in_stack_ffffffffffffffc4 = -in_stack_ffffffffffffffc4;
      }
      vVar1 = spectrum::operator[]
                        ((spectrum *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      if (vVar1 < 1) {
        vVar1 = -vVar1;
      }
      if (in_stack_ffffffffffffffc4 < vVar1) {
        return in_stack_ffffffffffffffc4;
      }
      in_stack_ffffffffffffffc0 =
           spectrum::operator[]
                     ((spectrum *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      if (in_stack_ffffffffffffffc0 < 1) {
        in_stack_ffffffffffffffc0 = -in_stack_ffffffffffffffc0;
      }
      vVar1 = spectrum::operator[]
                        ((spectrum *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      if (vVar1 < 1) {
        vVar1 = -vVar1;
      }
      if (in_stack_ffffffffffffffc0 == vVar1) {
        in_stack_ffffffffffffffbc =
             spectrum::operator[]
                       ((spectrum *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        vVar1 = spectrum::operator[]
                          ((spectrum *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                           ,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        if (in_stack_ffffffffffffffbc < vVar1) {
          return in_stack_ffffffffffffffbc;
        }
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void closer( spectrum& lspec )
  {
    for ( auto i = 0u; i < lspec.size(); ++i )
    {
      const auto j = order[i];
      if ( lspec[j] == best_spec[j] )
      {
        continue;
      }
      if ( abs( lspec[j] ) > abs( best_spec[j] ) ||
           ( abs( lspec[j] ) == abs( best_spec[j] ) && lspec[j] > best_spec[j] ) )
      {
        update_best( lspec );
        return;
      }

      if ( abs( lspec[j] ) < abs( best_spec[j] ) ||
           ( abs( lspec[j] ) == abs( best_spec[j] ) && lspec[j] < best_spec[j] ) )
      {
        return;
      }
    }

    if ( transformation_costs( transforms ) < transformation_costs( best_transforms ) )
    {
      update_best( lspec );
    }
  }